

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<long,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  long in_RCX;
  byte in_DL;
  GeometryAttribute *in_RDI;
  int i_1;
  long in_value;
  int i;
  uint8_t *src_address;
  long *in_stack_ffffffffffffffa8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc0;
  AttributeValueIndex in_stack_ffffffffffffffc4;
  int local_30;
  byte local_11 [17];
  
  local_11[0] = in_DL;
  GetAddress(in_RDI,in_stack_ffffffffffffffc4);
  local_30 = 0;
  while( true ) {
    iVar4 = local_30;
    pbVar3 = std::min<unsigned_char>(&in_RDI->num_components_,local_11);
    if ((int)(uint)*pbVar3 <= iVar4) {
      for (uVar2 = (uint)in_RDI->num_components_; (int)uVar2 < (int)(uint)local_11[0];
          uVar2 = uVar2 + 1) {
        *(undefined8 *)(in_RCX + (long)(int)uVar2 * 8) = 0;
      }
      return true;
    }
    bVar1 = IsAddressValid((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffc4.value_,in_stack_ffffffffffffffc0),
                           (uint8_t *)in_RDI);
    if (!bVar1) break;
    bVar1 = ConvertComponentValue<long,long>
                      ((long *)in_RDI,SUB41((uint)iVar4 >> 0x18,0),in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return false;
    }
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }